

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O2

void produce(int n)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  int *in_RSI;
  int local_3c;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    local_38.__r = 100;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
    poVar1 = std::operator<<((ostream *)&std::cout,"Producer (id#");
    __id._M_thread = pthread_self();
    pbVar2 = std::operator<<(poVar1,__id);
    poVar1 = std::operator<<(pbVar2,"): ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_3c);
    std::endl<char,std::char_traits<char>>(poVar1);
    in_RSI = &local_3c;
    rtb::Concurrency::Queue<int>::push(&q,&local_3c);
  }
  rtb::Concurrency::Queue<int>::close(&q,(int)in_RSI);
  return;
}

Assistant:

void produce(int n) {
    for (int i{ 0 }; i < n; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cout << "Producer (id#" << std::this_thread::get_id() << "): " << i << endl;
        q.push(i);
    }
    // Notify all the consumers that no more data is going to be pushed on the queue
    q.close();
}